

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_short>_>
::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_short>_>
          *this)

{
  QChar *pQVar1;
  bool bVar2;
  QChar *pQVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  long in_FS_OFFSET;
  QChar *local_50;
  char16_t local_48 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (this->a).a.a.a.a.a.m_size;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  lVar6 = 0;
  QString::QString(__return_storage_ptr__,lVar4 + 0x36,Uninitialized);
  local_50 = (QChar *)(__return_storage_ptr__->d).ptr;
  QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>_>
  ::appendTo<QChar>((type *)this,&local_50);
  builtin_memcpy(local_48,L"0123456789abcdef",0x20);
  pQVar1 = local_50;
  do {
    pQVar3 = pQVar1;
    pQVar3->ucs = local_48[*(byte *)((long)&(this->a).b.val + lVar6) & 0xf];
    pQVar3[1].ucs = local_48[*(byte *)((long)&(this->a).b.val + lVar6) >> 4];
    lVar6 = lVar6 + 1;
    pQVar1 = pQVar3 + 2;
  } while ((int)lVar6 != 4);
  builtin_memcpy(local_48,L"0123456789abcdef",0x20);
  lVar4 = 0;
  bVar2 = true;
  do {
    bVar5 = bVar2;
    pQVar3[lVar4 * 2 + 2].ucs = local_48[*(byte *)((long)&(this->b).val + lVar4) & 0xf];
    pQVar3[lVar4 * 2 + 3].ucs = local_48[*(byte *)((long)&(this->b).val + lVar4) >> 4];
    lVar4 = lVar4 + 1;
    bVar2 = false;
  } while (bVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }